

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O0

int argon2_hash(uint32_t t_cost,uint32_t m_cost,uint32_t parallelism,void *pwd,size_t pwdlen,
               void *salt,size_t saltlen,void *hash,size_t hashlen,char *encoded,size_t encodedlen,
               argon2_type type,uint32_t version)

{
  int iVar1;
  uint8_t *__src;
  uint8_t *out;
  undefined1 auStack_a8 [4];
  int result;
  argon2_context context;
  void *salt_local;
  size_t pwdlen_local;
  void *pwd_local;
  uint32_t parallelism_local;
  uint32_t m_cost_local;
  uint32_t t_cost_local;
  
  if (pwdlen < 0x100000000) {
    if (saltlen < 0x100000000) {
      if (hashlen < 0x100000000) {
        if (hashlen < 4) {
          m_cost_local = 0xfffffffe;
        }
        else {
          context._112_8_ = salt;
          __src = (uint8_t *)malloc(hashlen);
          if (__src == (uint8_t *)0x0) {
            m_cost_local = 0xffffffea;
          }
          else {
            context.out._0_4_ = (undefined4)hashlen;
            context.pwd._0_4_ = (undefined4)pwdlen;
            context.pwdlen = context.flags;
            context._28_4_ = context._116_4_;
            context.salt._0_4_ = (undefined4)saltlen;
            context.saltlen = 0;
            context._44_4_ = 0;
            context.secret._0_4_ = 0;
            context.secretlen = 0;
            context._60_4_ = 0;
            context.ad._0_4_ = 0;
            context.threads = 0;
            context.version = 0;
            context.allocate_cbk = (allocate_fptr)0x0;
            context.free_cbk._0_4_ = 0;
            context.lanes = version;
            _auStack_a8 = __src;
            context._8_8_ = pwd;
            context.ad._4_4_ = t_cost;
            context.adlen = m_cost;
            context.t_cost = parallelism;
            context.m_cost = parallelism;
            m_cost_local = argon2_ctx((argon2_context *)auStack_a8,type);
            if (m_cost_local == 0) {
              if (hash != (void *)0x0) {
                memcpy(hash,__src,hashlen);
              }
              if (((encoded == (char *)0x0) || (encodedlen == 0)) ||
                 (iVar1 = encode_string(encoded,encodedlen,(argon2_context *)auStack_a8,type),
                 iVar1 == 0)) {
                clear_internal_memory(__src,hashlen);
                free(__src);
                m_cost_local = 0;
              }
              else {
                clear_internal_memory(__src,hashlen);
                clear_internal_memory(encoded,encodedlen);
                free(__src);
                m_cost_local = 0xffffffe1;
              }
            }
            else {
              clear_internal_memory(__src,hashlen);
              free(__src);
            }
          }
        }
      }
      else {
        m_cost_local = 0xfffffffd;
      }
    }
    else {
      m_cost_local = 0xfffffff9;
    }
  }
  else {
    m_cost_local = 0xfffffffb;
  }
  return m_cost_local;
}

Assistant:

int argon2_hash(const uint32_t t_cost, const uint32_t m_cost,
                const uint32_t parallelism, const void *pwd,
                const size_t pwdlen, const void *salt, const size_t saltlen,
                void *hash, const size_t hashlen, char *encoded,
                const size_t encodedlen, argon2_type type,
                const uint32_t version){

    argon2_context context;
    int result;
    uint8_t *out;

    if (pwdlen > ARGON2_MAX_PWD_LENGTH) {
        return ARGON2_PWD_TOO_LONG;
    }

    if (saltlen > ARGON2_MAX_SALT_LENGTH) {
        return ARGON2_SALT_TOO_LONG;
    }

    if (hashlen > ARGON2_MAX_OUTLEN) {
        return ARGON2_OUTPUT_TOO_LONG;
    }

    if (hashlen < ARGON2_MIN_OUTLEN) {
        return ARGON2_OUTPUT_TOO_SHORT;
    }

    out = malloc(hashlen);
    if (!out) {
        return ARGON2_MEMORY_ALLOCATION_ERROR;
    }

    context.out = (uint8_t *)out;
    context.outlen = (uint32_t)hashlen;
    context.pwd = CONST_CAST(uint8_t *)pwd;
    context.pwdlen = (uint32_t)pwdlen;
    context.salt = CONST_CAST(uint8_t *)salt;
    context.saltlen = (uint32_t)saltlen;
    context.secret = NULL;
    context.secretlen = 0;
    context.ad = NULL;
    context.adlen = 0;
    context.t_cost = t_cost;
    context.m_cost = m_cost;
    context.lanes = parallelism;
    context.threads = parallelism;
    context.allocate_cbk = NULL;
    context.free_cbk = NULL;
    context.flags = ARGON2_DEFAULT_FLAGS;
    context.version = version;

    result = argon2_ctx(&context, type);

    if (result != ARGON2_OK) {
        clear_internal_memory(out, hashlen);
        free(out);
        return result;
    }

    /* if raw hash requested, write it */
    if (hash) {
        memcpy(hash, out, hashlen);
    }

    /* if encoding requested, write it */
    if (encoded && encodedlen) {
        if (encode_string(encoded, encodedlen, &context, type) != ARGON2_OK) {
            clear_internal_memory(out, hashlen); /* wipe buffers if error */
            clear_internal_memory(encoded, encodedlen);
            free(out);
            return ARGON2_ENCODING_FAIL;
        }
    }
    clear_internal_memory(out, hashlen);
    free(out);

    return ARGON2_OK;
}